

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O0

void Eigen::internal::triangular_solve_matrix<double,_long,_2,_2,_false,_1,_0>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherStride
               ,level3_blocking<double,_double> *blocking)

{
  long lVar1;
  long lVar2;
  RhsScalar *pRVar3;
  long lVar4;
  undefined8 uVar5;
  long *plVar6;
  ulong size_00;
  ulong size_01;
  ulong size_02;
  LhsScalar *pLVar7;
  double **ppdVar8;
  long lVar9;
  double *rhs_00;
  double *pdVar10;
  double *pdVar11;
  long lVar12;
  double *local_318 [4];
  double *local_2f8;
  double *local_2f0;
  double *local_2e8;
  double *local_2e0;
  double *local_2d8;
  double *local_2d0;
  double *local_2c8;
  double *local_2c0;
  RhsScalar *local_2b8;
  RhsScalar *local_2b0;
  RhsScalar *local_2a8;
  RhsScalar *local_2a0;
  RhsScalar *local_298;
  RhsScalar *local_290;
  double *local_288;
  RhsScalar *local_280;
  RhsScalar *local_278;
  RhsScalar *local_270;
  RhsScalar *local_268;
  RhsScalar *local_260;
  RhsScalar *local_258;
  double *local_250;
  LhsScalar *local_248;
  LhsScalar *local_240;
  long local_238;
  long i_1;
  double b_1;
  long i;
  double *a;
  double b;
  long k3;
  double *r;
  long j;
  long k;
  long panelLength_1;
  long panelOffset_1;
  long absolute_j2;
  long local_1d0;
  long local_1c8;
  long actualPanelWidth_1;
  long j2_1;
  long local_1b0;
  long actual_mc;
  long i2;
  long panelLength;
  long panelOffset;
  long actual_j2;
  long local_180;
  long local_178;
  long actualPanelWidth;
  long j2;
  double *geb;
  long rs;
  long startPanel;
  long actual_k2;
  long local_140;
  long actual_kc;
  long k2;
  undefined1 local_128 [3];
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_true> pack_lhs_panel;
  gemm_pack_rhs<double,_long,_4,_1,_false,_true> pack_rhs_panel;
  gemm_pack_rhs<double,_long,_4,_1,_false,_false> pack_rhs;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp_kernel;
  conj_if<false> conj;
  aligned_stack_memory_handler<double> blockW_stack_memory_destructor;
  double *blockW;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  double *blockB;
  undefined1 local_d8 [8];
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  double *blockA;
  size_t sizeW;
  size_t sizeB;
  size_t sizeA;
  long local_98;
  long mc;
  long kc;
  blas_data_mapper<double,_long,_0> lhs;
  const_blas_data_mapper<double,_long,_1> rhs;
  long rows;
  long otherStride_local;
  double *_other_local;
  long triStride_local;
  double *_tri_local;
  long otherSize_local;
  long size_local;
  
  ppdVar8 = local_318;
  rhs.m_stride = otherSize;
  const_blas_data_mapper<double,_long,_1>::const_blas_data_mapper
            ((const_blas_data_mapper<double,_long,_1> *)&lhs.m_stride,_tri,triStride);
  blas_data_mapper<double,_long,_0>::blas_data_mapper
            ((blas_data_mapper<double,_long,_0> *)&kc,_other,otherStride);
  mc = level3_blocking<double,_double>::kc(blocking);
  sizeA = level3_blocking<double,_double>::mc(blocking);
  plVar6 = std::min<long>(&rhs.m_stride,(long *)&sizeA);
  lVar12 = mc;
  local_98 = *plVar6;
  size_00 = mc * local_98;
  size_01 = mc * size;
  size_02 = mc * 8;
  if (0x1fffffffffffffff < size_00) {
    throw_std_bad_alloc();
  }
  pLVar7 = level3_blocking<double,_double>::blockA(blocking);
  if (pLVar7 == (LhsScalar *)0x0) {
    if (size_00 * 8 < 0x20001) {
      ppdVar8 = (double **)((long)local_318 - (size_00 * 8 + 0xf & 0xfffffffffffffff0));
      local_248 = (LhsScalar *)ppdVar8;
    }
    else {
      local_248 = (LhsScalar *)aligned_malloc(size_00 * 8);
    }
    local_240 = local_248;
  }
  else {
    local_240 = level3_blocking<double,_double>::blockA(blocking);
    ppdVar8 = local_318;
  }
  blockA_stack_memory_destructor._16_8_ = local_240;
  *(undefined8 *)((long)ppdVar8 + -8) = 0x11602e;
  pLVar7 = level3_blocking<double,_double>::blockA(blocking);
  if (pLVar7 == (LhsScalar *)0x0) {
    local_250 = (double *)blockA_stack_memory_destructor._16_8_;
  }
  else {
    local_250 = (double *)0x0;
  }
  pdVar11 = local_250;
  *(undefined8 *)((long)ppdVar8 + -8) = 0x116083;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_d8,pdVar11,size_00,0x20000 < size_00 * 8)
  ;
  if (0x1fffffffffffffff < size_01) {
    *(undefined8 *)((long)ppdVar8 + -8) = 0x1160a3;
    throw_std_bad_alloc();
  }
  *(undefined8 *)((long)ppdVar8 + -8) = 0x1160b2;
  local_258 = level3_blocking<double,_double>::blockB(blocking);
  if (local_258 == (RhsScalar *)0x0) {
    if (size_01 * 8 < 0x20001) {
      ppdVar8 = (double **)((long)ppdVar8 + -(size_01 * 8 + 0xf & 0xfffffffffffffff0));
      local_270 = (RhsScalar *)ppdVar8;
    }
    else {
      *(undefined8 *)((long)ppdVar8 + -8) = 0x116132;
      local_278 = (RhsScalar *)aligned_malloc(size_01 * 8);
      local_270 = local_278;
    }
    local_268 = local_270;
  }
  else {
    *(undefined8 *)((long)ppdVar8 + -8) = 0x1160d1;
    local_268 = level3_blocking<double,_double>::blockB(blocking);
    local_260 = local_268;
  }
  blockB_stack_memory_destructor._16_8_ = local_268;
  *(undefined8 *)((long)ppdVar8 + -8) = 0x116170;
  local_280 = level3_blocking<double,_double>::blockB(blocking);
  if (local_280 == (RhsScalar *)0x0) {
    local_288 = (double *)blockB_stack_memory_destructor._16_8_;
  }
  else {
    local_288 = (double *)0x0;
  }
  pdVar11 = local_288;
  *(undefined8 *)((long)ppdVar8 + -8) = 0x1161ce;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockW,pdVar11,size_01,0x20000 < size_01 * 8);
  if (0x1fffffffffffffff < size_02) {
    *(undefined8 *)((long)ppdVar8 + -8) = 0x1161f0;
    throw_std_bad_alloc();
  }
  *(undefined8 *)((long)ppdVar8 + -8) = 0x1161ff;
  local_290 = level3_blocking<double,_double>::blockW(blocking);
  if (local_290 == (RhsScalar *)0x0) {
    if ((ulong)(lVar12 << 6) < 0x20001) {
      ppdVar8 = (double **)((long)ppdVar8 + lVar12 * -0x40);
      local_2a8 = (RhsScalar *)ppdVar8;
    }
    else {
      *(undefined8 *)((long)ppdVar8 + -8) = 0x11627f;
      local_2b0 = (RhsScalar *)aligned_malloc(lVar12 << 6);
      local_2a8 = local_2b0;
    }
    local_2a0 = local_2a8;
  }
  else {
    *(undefined8 *)((long)ppdVar8 + -8) = 0x11621e;
    local_2a0 = level3_blocking<double,_double>::blockW(blocking);
    local_298 = local_2a0;
  }
  pRVar3 = local_2a0;
  *(undefined8 *)((long)ppdVar8 + -8) = 0x1162bd;
  local_2b8 = level3_blocking<double,_double>::blockW(blocking);
  if (local_2b8 == (RhsScalar *)0x0) {
    local_2c0 = pRVar3;
  }
  else {
    local_2c0 = (double *)0x0;
  }
  pdVar11 = local_2c0;
  *(undefined8 *)((long)ppdVar8 + -8) = 0x11631b;
  aligned_stack_memory_handler<double>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_128,pdVar11,size_02,
             0x20000 < (ulong)(lVar12 << 6));
  for (actual_kc = 0; actual_kc < size; actual_kc = mc + actual_kc) {
    actual_k2 = size - actual_kc;
    *(undefined8 *)((long)ppdVar8 + -8) = 0x11635e;
    plVar6 = std::min<long>(&actual_k2,&mc);
    lVar12 = actual_kc;
    local_140 = *plVar6;
    startPanel = actual_kc;
    lVar9 = actual_kc + local_140;
    geb = (double *)((size - actual_kc) - local_140);
    j2 = blockB_stack_memory_destructor._16_8_ + local_140 * local_140 * 8;
    rs = lVar9;
    if (0 < (long)geb) {
      local_2d0 = (double *)j2;
      *(undefined8 *)((long)ppdVar8 + -8) = 0x1163fb;
      rhs_00 = const_blas_data_mapper<double,_long,_1>::operator()
                         ((const_blas_data_mapper<double,_long,_1> *)&lhs.m_stride,lVar12,lVar9);
      lVar12 = local_140;
      pdVar10 = geb;
      pdVar11 = local_2d0;
      local_2c8 = rhs_00;
      *(undefined8 *)((long)ppdVar8 + -8) = 0;
      *(undefined8 *)((long)ppdVar8 + -0x10) = 0;
      *(undefined8 *)((long)ppdVar8 + -0x18) = 0x116446;
      gemm_pack_rhs<double,_long,_4,_1,_false,_false>::operator()
                ((gemm_pack_rhs<double,_long,_4,_1,_false,_false> *)((long)&k2 + 5),pdVar11,rhs_00,
                 triStride,lVar12,(long)pdVar10,*(long *)((long)ppdVar8 + -0x10),
                 *(long *)((long)ppdVar8 + -8));
    }
    for (actualPanelWidth = 0; actualPanelWidth < local_140; actualPanelWidth = actualPanelWidth + 4
        ) {
      local_180 = local_140 - actualPanelWidth;
      actual_j2 = 4;
      *(undefined8 *)((long)ppdVar8 + -8) = 0x1164f1;
      plVar6 = std::min<long>(&local_180,&actual_j2);
      lVar12 = startPanel;
      local_178 = *plVar6;
      lVar9 = startPanel + actualPanelWidth;
      panelLength = 0;
      i2 = actualPanelWidth;
      panelOffset = lVar9;
      if (0 < actualPanelWidth) {
        local_2e0 = (double *)
                    (blockB_stack_memory_destructor._16_8_ + actualPanelWidth * local_140 * 8);
        *(undefined8 *)((long)ppdVar8 + -8) = 0x11657c;
        pdVar10 = const_blas_data_mapper<double,_long,_1>::operator()
                            ((const_blas_data_mapper<double,_long,_1> *)&lhs.m_stride,lVar12,lVar9);
        lVar1 = local_140;
        lVar9 = local_178;
        lVar12 = i2;
        pdVar11 = local_2e0;
        local_2d8 = pdVar10;
        *(long *)((long)ppdVar8 + -8) = panelLength;
        *(long *)((long)ppdVar8 + -0x10) = lVar1;
        *(undefined8 *)((long)ppdVar8 + -0x18) = 0x1165cd;
        gemm_pack_rhs<double,_long,_4,_1,_false,_true>::operator()
                  ((gemm_pack_rhs<double,_long,_4,_1,_false,_true> *)((long)&k2 + 4),pdVar11,pdVar10
                   ,triStride,lVar12,lVar9,*(long *)((long)ppdVar8 + -0x10),
                   *(long *)((long)ppdVar8 + -8));
      }
    }
    for (actual_mc = 0; actual_mc < rhs.m_stride; actual_mc = local_98 + actual_mc) {
      j2_1 = rhs.m_stride - actual_mc;
      *(undefined8 *)((long)ppdVar8 + -8) = 0x11662f;
      plVar6 = std::min<long>(&local_98,&j2_1);
      local_1b0 = *plVar6;
      for (actualPanelWidth_1 = 0; uVar5 = blockA_stack_memory_destructor._16_8_, lVar1 = local_140,
          pdVar11 = geb, lVar9 = j2, lVar12 = local_1b0, actualPanelWidth_1 < local_140;
          actualPanelWidth_1 = actualPanelWidth_1 + 4) {
        local_1d0 = local_140 - actualPanelWidth_1;
        absolute_j2 = 4;
        *(undefined8 *)((long)ppdVar8 + -8) = 0x11668b;
        plVar6 = std::min<long>(&local_1d0,&absolute_j2);
        lVar12 = actual_mc;
        local_1c8 = *plVar6;
        lVar9 = startPanel + actualPanelWidth_1;
        panelOffset_1 = lVar9;
        panelLength_1 = 0;
        k = actualPanelWidth_1;
        if (0 < actualPanelWidth_1) {
          *(undefined8 *)((long)ppdVar8 + -8) = 0x1166e8;
          pdVar10 = blas_data_mapper<double,_long,_0>::operator()
                              ((blas_data_mapper<double,_long,_0> *)&kc,lVar12,lVar9);
          uVar5 = blockA_stack_memory_destructor._16_8_;
          lVar4 = local_140;
          lVar2 = local_1b0;
          lVar1 = local_1c8;
          lVar9 = panelLength_1;
          lVar12 = k;
          local_2e8 = pdVar10;
          pdVar11 = (double *)
                    (blockB_stack_memory_destructor._16_8_ + actualPanelWidth_1 * local_140 * 8);
          *(RhsScalar **)((long)ppdVar8 + -0x10) = pRVar3;
          *(long *)((long)ppdVar8 + -0x18) = lVar9;
          *(long *)((long)ppdVar8 + -0x20) = lVar9;
          *(long *)((long)ppdVar8 + -0x28) = lVar4;
          *(long *)((long)ppdVar8 + -0x30) = lVar4;
          *(long *)((long)ppdVar8 + -0x38) = lVar1;
          *(long *)((long)ppdVar8 + -0x40) = lVar12;
          *(undefined8 *)((long)ppdVar8 + -0x48) = 0x116779;
          gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                    ((gebp_kernel<double,_double,_long,_4,_4,_false,_false> *)((long)&k2 + 6),
                     pdVar10,otherStride,(double *)uVar5,pdVar11,lVar2,
                     *(long *)((long)ppdVar8 + -0x40),*(long *)((long)ppdVar8 + -0x38),-1.0,
                     *(long *)((long)ppdVar8 + -0x30),*(long *)((long)ppdVar8 + -0x28),
                     *(long *)((long)ppdVar8 + -0x20),*(long *)((long)ppdVar8 + -0x18),
                     *(double **)((long)ppdVar8 + -0x10));
        }
        for (j = 0; uVar5 = blockA_stack_memory_destructor._16_8_, lVar2 = local_140,
            lVar1 = actual_mc, lVar9 = local_1b0, lVar12 = local_1c8, j < local_1c8; j = j + 1) {
          pdVar11 = (double *)(panelOffset_1 + j);
          r = pdVar11;
          *(undefined8 *)((long)ppdVar8 + -8) = 0x1167cf;
          local_2f0 = blas_data_mapper<double,_long,_0>::operator()
                                ((blas_data_mapper<double,_long,_0> *)&kc,lVar1,(long)pdVar11);
          k3 = (long)local_2f0;
          for (b = 0.0; pdVar11 = r, (long)b < j; b = (double)((long)b + 1)) {
            lVar12 = panelOffset_1 + (long)b;
            *(undefined8 *)((long)ppdVar8 + -8) = 0x116826;
            pdVar11 = const_blas_data_mapper<double,_long,_1>::operator()
                                ((const_blas_data_mapper<double,_long,_1> *)&lhs.m_stride,lVar12,
                                 (long)pdVar11);
            local_2f8 = pdVar11;
            *(undefined8 *)((long)ppdVar8 + -8) = 0x116842;
            local_318[3] = conj_if<false>::operator()((conj_if<false> *)((long)&k2 + 7),pdVar11);
            lVar12 = actual_mc;
            a = (double *)*local_318[3];
            lVar9 = panelOffset_1 + (long)b;
            *(undefined8 *)((long)ppdVar8 + -8) = 0x11687f;
            local_318[2] = blas_data_mapper<double,_long,_0>::operator()
                                     ((blas_data_mapper<double,_long,_0> *)&kc,lVar12,lVar9);
            for (b_1 = 0.0; (long)b_1 < local_1b0; b_1 = (double)((long)b_1 + 1)) {
              *(double *)(k3 + (long)b_1 * 8) =
                   -local_318[2][(long)b_1] * (double)a + *(double *)(k3 + (long)b_1 * 8);
            }
            i = (long)local_318[2];
          }
          *(undefined8 *)((long)ppdVar8 + -8) = 0x116943;
          pdVar11 = const_blas_data_mapper<double,_long,_1>::operator()
                              ((const_blas_data_mapper<double,_long,_1> *)&lhs.m_stride,
                               (long)pdVar11,(long)pdVar11);
          local_318[1] = pdVar11;
          *(undefined8 *)((long)ppdVar8 + -8) = 0x11695f;
          local_318[0] = conj_if<false>::operator()((conj_if<false> *)((long)&k2 + 7),pdVar11);
          i_1 = (long)*local_318[0];
          for (local_238 = 0; local_238 < local_1b0; local_238 = local_238 + 1) {
            *(double *)(k3 + local_238 * 8) = *(double *)(k3 + local_238 * 8) / (double)i_1;
          }
        }
        lVar1 = panelOffset_1 * otherStride + actual_mc;
        *(long *)((long)ppdVar8 + -8) = actualPanelWidth_1;
        *(long *)((long)ppdVar8 + -0x10) = lVar2;
        *(undefined8 *)((long)ppdVar8 + -0x18) = 0x116a46;
        gemm_pack_lhs<double,_long,_4,_2,_0,_false,_true>::operator()
                  ((gemm_pack_lhs<double,_long,_4,_2,_0,_false,_true> *)((long)&k2 + 3),
                   (double *)uVar5,_other + lVar1,otherStride,lVar12,lVar9,
                   *(long *)((long)ppdVar8 + -0x10),*(long *)((long)ppdVar8 + -8));
      }
      if (0 < (long)geb) {
        lVar2 = actual_mc + rs * otherStride;
        *(RhsScalar **)((long)ppdVar8 + -0x10) = pRVar3;
        *(double **)((long)ppdVar8 + -0x38) = pdVar11;
        *(long *)((long)ppdVar8 + -0x40) = lVar1;
        *(undefined8 *)((long)ppdVar8 + -0x18) = 0;
        *(undefined8 *)((long)ppdVar8 + -0x20) = 0;
        *(undefined8 *)((long)ppdVar8 + -0x28) = 0xffffffffffffffff;
        *(undefined8 *)((long)ppdVar8 + -0x30) = 0xffffffffffffffff;
        *(undefined8 *)((long)ppdVar8 + -0x48) = 0x116b05;
        gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                  ((gebp_kernel<double,_double,_long,_4,_4,_false,_false> *)((long)&k2 + 6),
                   _other + lVar2,otherStride,(double *)uVar5,(double *)lVar9,lVar12,
                   *(long *)((long)ppdVar8 + -0x40),*(long *)((long)ppdVar8 + -0x38),-1.0,
                   *(long *)((long)ppdVar8 + -0x30),*(long *)((long)ppdVar8 + -0x28),
                   *(long *)((long)ppdVar8 + -0x20),*(long *)((long)ppdVar8 + -0x18),
                   *(double **)((long)ppdVar8 + -0x10));
      }
    }
  }
  *(undefined8 *)((long)ppdVar8 + -8) = 0x116b51;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_128);
  *(undefined8 *)((long)ppdVar8 + -8) = 0x116b5d;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockW);
  *(undefined8 *)((long)ppdVar8 + -8) = 0x116b69;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_d8);
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheRight,Mode,Conjugate,TriStorageOrder,ColMajor>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index rows = otherSize;
    const_blas_data_mapper<Scalar, Index, TriStorageOrder> rhs(_tri,triStride);
    blas_data_mapper<Scalar, Index, ColMajor> lhs(_other,otherStride);

    typedef gebp_traits<Scalar,Scalar> Traits;
    enum {
      RhsStorageOrder   = TriStorageOrder,
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(rows,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*size;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockW, sizeW, blocking.blockW());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar,Scalar, Index, Traits::mr, Traits::nr, false, Conjugate> gebp_kernel;
    gemm_pack_rhs<Scalar, Index, Traits::nr,RhsStorageOrder> pack_rhs;
    gemm_pack_rhs<Scalar, Index, Traits::nr,RhsStorageOrder,false,true> pack_rhs_panel;
    gemm_pack_lhs<Scalar, Index, Traits::mr, Traits::LhsProgress, ColMajor, false, true> pack_lhs_panel;

    for(Index k2=IsLower ? size : 0;
        IsLower ? k2>0 : k2<size;
        IsLower ? k2-=kc : k2+=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? k2 : size-k2, kc);
      Index actual_k2 = IsLower ? k2-actual_kc : k2 ;

      Index startPanel = IsLower ? 0 : k2+actual_kc;
      Index rs = IsLower ? actual_k2 : size - actual_k2 - actual_kc;
      Scalar* geb = blockB+actual_kc*actual_kc;

      if (rs>0) pack_rhs(geb, &rhs(actual_k2,startPanel), triStride, actual_kc, rs);

      // triangular packing (we only pack the panels off the diagonal,
      // neglecting the blocks overlapping the diagonal
      {
        for (Index j2=0; j2<actual_kc; j2+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-j2, SmallPanelWidth);
          Index actual_j2 = actual_k2 + j2;
          Index panelOffset = IsLower ? j2+actualPanelWidth : 0;
          Index panelLength = IsLower ? actual_kc-j2-actualPanelWidth : j2;

          if (panelLength>0)
          pack_rhs_panel(blockB+j2*actual_kc,
                         &rhs(actual_k2+panelOffset, actual_j2), triStride,
                         panelLength, actualPanelWidth,
                         actual_kc, panelOffset);
        }
      }

      for(Index i2=0; i2<rows; i2+=mc)
      {
        const Index actual_mc = (std::min)(mc,rows-i2);

        // triangular solver kernel
        {
          // for each small block of the diagonal (=> vertical panels of rhs)
          for (Index j2 = IsLower
                      ? (actual_kc - ((actual_kc%SmallPanelWidth) ? Index(actual_kc%SmallPanelWidth)
                                                                  : Index(SmallPanelWidth)))
                      : 0;
               IsLower ? j2>=0 : j2<actual_kc;
               IsLower ? j2-=SmallPanelWidth : j2+=SmallPanelWidth)
          {
            Index actualPanelWidth = std::min<Index>(actual_kc-j2, SmallPanelWidth);
            Index absolute_j2 = actual_k2 + j2;
            Index panelOffset = IsLower ? j2+actualPanelWidth : 0;
            Index panelLength = IsLower ? actual_kc - j2 - actualPanelWidth : j2;

            // GEBP
            if(panelLength>0)
            {
              gebp_kernel(&lhs(i2,absolute_j2), otherStride,
                          blockA, blockB+j2*actual_kc,
                          actual_mc, panelLength, actualPanelWidth,
                          Scalar(-1),
                          actual_kc, actual_kc, // strides
                          panelOffset, panelOffset, // offsets
                          blockW);  // workspace
            }

            // unblocked triangular solve
            for (Index k=0; k<actualPanelWidth; ++k)
            {
              Index j = IsLower ? absolute_j2+actualPanelWidth-k-1 : absolute_j2+k;

              Scalar* r = &lhs(i2,j);
              for (Index k3=0; k3<k; ++k3)
              {
                Scalar b = conj(rhs(IsLower ? j+1+k3 : absolute_j2+k3,j));
                Scalar* a = &lhs(i2,IsLower ? j+1+k3 : absolute_j2+k3);
                for (Index i=0; i<actual_mc; ++i)
                  r[i] -= a[i] * b;
              }
              if((Mode & UnitDiag)==0)
              {
                Scalar b = conj(rhs(j,j));
                for (Index i=0; i<actual_mc; ++i)
                  r[i] /= b;
              }
            }

            // pack the just computed part of lhs to A
            pack_lhs_panel(blockA, _other+absolute_j2*otherStride+i2, otherStride,
                           actualPanelWidth, actual_mc,
                           actual_kc, j2);
          }
        }

        if (rs>0)
          gebp_kernel(_other+i2+startPanel*otherStride, otherStride, blockA, geb,
                      actual_mc, actual_kc, rs, Scalar(-1),
                      -1, -1, 0, 0, blockW);
      }
    }
  }